

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_127a7::TestCheckEqualWithUnsignedLong::RunImpl
          (TestCheckEqualWithUnsignedLong *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  unsigned_long something;
  TestDetails local_40;
  TestResults results;
  
  UnitTest::TestResults::TestResults(&results,(TestReporter *)0x0);
  something = 2;
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_40,*ppTVar2,0xe);
  UnitTest::CheckEqual<unsigned_long,unsigned_long>(results_00,&something,&something,&local_40);
  return;
}

Assistant:

TEST(CheckEqualWithUnsignedLong)
{
    TestResults results;
    unsigned long something = 2;
    CHECK_EQUAL(something, something);
}